

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_NewEnumTest_Test::~TApp_NewEnumTest_Test(TApp_NewEnumTest_Test *this)

{
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_0019e9d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_TApp).args);
  CLI::App::~App(&(this->super_TApp).app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, NewEnumTest) {
    enum class Level2 : std::int32_t { High, Medium, Low };
    Level2 level = Level2::Low;
    app.add_option("--level", level);

    args = {"--level", "1"};
    run();
    EXPECT_EQ(level, Level2::Medium);
}